

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase266::run(TestCase266 *this)

{
  uint uVar1;
  Iterator __begin2;
  uint uVar2;
  bool bVar3;
  uint expected;
  DebugComparison<kj::SafeUnwrapper<10UL,_unsigned_char>,_unsigned_int> _kjCondition;
  
  for (expected = 0; expected != 10; expected = expected + 1) {
    _kjCondition.op.content.ptr = (char *)0x0;
  }
  _kjCondition._0_8_ = &expected;
  _kjCondition.op.content.ptr = (char *)CONCAT44(_kjCondition.op.content.ptr._4_4_,10);
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_4fea7;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if ((expected != 10) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[32],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
               ,0x110,ERROR,"\"failed: expected \" \"expected == 10\", _kjCondition",
               (char (*) [32])"failed: expected expected == 10",
               (DebugComparison<unsigned_int_&,_int> *)&_kjCondition);
  }
  expected = 0;
  for (uVar2 = 0; uVar2 != 10; uVar2 = uVar2 + 1) {
    uVar1 = expected + 1;
    _kjCondition.left.value = (uchar)uVar2;
    _kjCondition.right = expected;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    bVar3 = uVar2 == expected;
    _kjCondition.result = bVar3;
    expected = uVar1;
    if ((!bVar3) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[46],kj::_::DebugComparison<kj::SafeUnwrapper<255ul,unsigned_char>,unsigned_int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
                 ,0x115,ERROR,"\"failed: expected \" \"unbound(value) == expected++\", _kjCondition"
                 ,(char (*) [46])"failed: expected unbound(value) == expected++",
                 (DebugComparison<kj::SafeUnwrapper<255UL,_unsigned_char>,_unsigned_int> *)
                 &_kjCondition);
    }
  }
  _kjCondition._0_8_ = &expected;
  _kjCondition.op.content.ptr = (char *)CONCAT44(_kjCondition.op.content.ptr._4_4_,10);
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_4fea7;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if ((expected != 10) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[32],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
               ,0x117,ERROR,"\"failed: expected \" \"expected == 10\", _kjCondition",
               (char (*) [32])"failed: expected expected == 10",
               (DebugComparison<unsigned_int_&,_int> *)&_kjCondition);
  }
  expected = 3;
  for (uVar2 = 3; uVar2 != 10; uVar2 = uVar2 + 1) {
    uVar1 = expected + 1;
    _kjCondition.left.value = (uchar)uVar2;
    _kjCondition.right = expected;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    bVar3 = uVar2 == expected;
    _kjCondition.result = bVar3;
    expected = uVar1;
    if ((!bVar3) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[46],kj::_::DebugComparison<kj::SafeUnwrapper<255ul,unsigned_char>,unsigned_int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
                 ,0x11c,ERROR,"\"failed: expected \" \"unbound(value) == expected++\", _kjCondition"
                 ,(char (*) [46])"failed: expected unbound(value) == expected++",
                 (DebugComparison<kj::SafeUnwrapper<255UL,_unsigned_char>,_unsigned_int> *)
                 &_kjCondition);
    }
  }
  _kjCondition._0_8_ = &expected;
  _kjCondition.op.content.ptr = (char *)CONCAT44(_kjCondition.op.content.ptr._4_4_,10);
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_4fea7;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if ((expected != 10) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[32],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/units-test.c++"
               ,0x11e,ERROR,"\"failed: expected \" \"expected == 10\", _kjCondition",
               (char (*) [32])"failed: expected expected == 10",
               (DebugComparison<unsigned_int_&,_int> *)&_kjCondition);
  }
  return;
}

Assistant:

TEST(UnitMeasure, BoundedRange) {
  uint expected = 0;
  for (auto i: zeroTo(bounded<10>())) {
    Bounded<10, uint8_t> value = i;
    KJ_EXPECT(unbound(value) == expected++);
  }
  KJ_EXPECT(expected == 10);

  expected = 0;
  for (auto i: zeroTo(bounded((uint8_t)10))) {
    Bounded<255, uint8_t> value = i;
    KJ_EXPECT(unbound(value) == expected++);
  }
  KJ_EXPECT(expected == 10);

  expected = 3;
  for (auto i: range(bounded((uint8_t)3), bounded((uint8_t)10))) {
    Bounded<255, uint8_t> value = i;
    KJ_EXPECT(unbound(value) == expected++);
  }
  KJ_EXPECT(expected == 10);
}